

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O1

void __thiscall ConcurrentStack<int>::push(ConcurrentStack<int> *this,int *item)

{
  _Map_pointer ppiVar1;
  _Elt_pointer piVar2;
  long lVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  undefined1 local_48 [8];
  unique_lock<std::mutex> mlock;
  
  local_48 = (undefined1  [8])&this->mutex_;
  mlock._M_device._0_1_ = 0;
  mlock._8_8_ = item;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  mlock._M_device._0_1_ = 1;
  if (this->bounded_ == true) {
    do {
      ppiVar1 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (((long)(this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 2) +
          ((long)(this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 2) +
          ((((ulong)((long)ppiVar1 -
                    (long)(this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppiVar1 == (_Map_pointer)0x0)) * 0x80 < this->max_size_) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can\'t push : queue is full !\n",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_50.__d.__r = (duration)((this->timeout_).__r * 1000000 + lVar3);
      std::condition_variable::
      __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&this->queue_full_,(unique_lock<std::mutex> *)local_48,&local_50);
    } while (this->bounded_ != false);
  }
  piVar2 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 == (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const>
              ((deque<int,std::allocator<int>> *)this,(int *)mlock._8_8_);
  }
  else {
    *piVar2 = *(int *)mlock._8_8_;
    (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = piVar2 + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void push(const T&& item) {
        {
            std::unique_lock<std::mutex> mlock(mutex_);
            while (bounded_ && stack_.size() >= max_size_) {
                std::cout  << "Can't push : queue is full !\n" << std::endl;
                queue_full_.wait_for(mlock, timeout_);
            }
            stack_.emplace(std::move(item));
        }
        queue_empty_.notify_one();
    }